

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  cmExpandedCommandArgument *pcVar1;
  CompareOp op;
  _List_node_base *p_Var2;
  iterator iVar3;
  cmMakefile *pcVar4;
  pointer pcVar5;
  CurrentAndTwoMoreIter args;
  CurrentAndTwoMoreIter args_00;
  CurrentAndTwoMoreIter args_01;
  CurrentAndTwoMoreIter args_02;
  CurrentAndTwoMoreIter args_03;
  CurrentAndTwoMoreIter args_04;
  bool bVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  _List_node_base *p_Var15;
  _List_node_base *p_Var16;
  iterator iVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  cmValue cVar21;
  string *psVar22;
  cmValue cVar23;
  ostream *poVar24;
  string *f2;
  Status SVar25;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var26;
  uint uVar27;
  PolicyID id;
  PolicyID id_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  char cVar29;
  _List_node_base *p_Var30;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  static_string_view keyword_04;
  static_string_view keyword_05;
  static_string_view keyword_06;
  static_string_view keyword_07;
  static_string_view keyword_08;
  static_string_view keyword_09;
  static_string_view keyword_10;
  static_string_view keyword_11;
  static_string_view keyword_12;
  static_string_view keyword_13;
  static_string_view keyword_14;
  static_string_view keyword_15;
  static_string_view keyword_16;
  static_string_view keyword_17;
  static_string_view keyword_18;
  string_view arg;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string def_buf;
  RegularExpression regEntry;
  ostringstream error;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string *local_380;
  MessageType *local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  _List_node_base *local_358;
  _List_node_base *p_Stack_350;
  _List_node_base *local_348;
  _List_node_base *local_340;
  _List_node_base *p_Stack_338;
  _List_node_base *local_330;
  undefined1 local_328 [176];
  char *local_278;
  char *local_268;
  int local_260;
  _List_node_base *local_258;
  _List_node_base *p_Stack_250;
  _List_node_base *local_248;
  _List_node_base *local_240;
  _List_node_base *p_Stack_238;
  _List_node_base *local_230;
  _List_node_base *local_228;
  _List_node_base *p_Stack_220;
  _List_node_base *local_218;
  _List_node_base *local_210;
  _List_node_base *p_Stack_208;
  _List_node_base *local_200;
  _List_node_base *local_1f8;
  _List_node_base *p_Stack_1f0;
  _List_node_base *local_1e8;
  _List_node_base *local_1e0;
  _List_node_base *p_Stack_1d8;
  _List_node_base *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  path local_1a8 [2];
  ios_base local_138 [264];
  
  p_Var2 = (newArgs->
           super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var30 = p_Var2;
  if (p_Var2 != (_List_node_base *)newArgs) {
    p_Var30 = p_Var2->_M_next;
  }
  local_380 = errorString;
  local_378 = status;
  iVar3._M_node = p_Var30;
  if (p_Var30 != (_List_node_base *)newArgs) {
    iVar3._M_node = p_Var30->_M_next;
  }
  do {
    bVar6 = p_Var2 == (_List_node_base *)newArgs;
    if (bVar6) {
      return bVar6;
    }
    paVar28 = &local_3e0.field_2;
    if ((p_Var30 != (_List_node_base *)newArgs) &&
       (keyword.super_string_view._M_str = DAT_008e41f8,
       keyword.super_string_view._M_len = (anonymous_namespace)::keyMATCHES,
       bVar18 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)(p_Var2 + 1)), bVar18)) {
      bVar18 = false;
      args.next._M_node = p_Var30;
      args.current._M_node = p_Var2;
      args.nextnext._M_node = iVar3._M_node;
      local_1e0 = p_Var2;
      p_Stack_1d8 = p_Var30;
      local_1d0 = iVar3._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter>
                (newArgs,false,args);
      goto LAB_004c14f0;
    }
    bVar18 = false;
    if (iVar3._M_node == (_List_node_base *)newArgs || p_Var30 == (_List_node_base *)newArgs)
    goto LAB_004c14f0;
    pcVar1 = (cmExpandedCommandArgument *)(p_Var30 + 1);
    keyword_00.super_string_view._M_str = DAT_008e41f8;
    keyword_00.super_string_view._M_len = (anonymous_namespace)::keyMATCHES;
    bVar18 = IsKeyword(this,keyword_00,pcVar1);
    pcVar14 = DAT_008e41e8;
    sVar13 = (anonymous_namespace)::keyLESS_EQUAL;
    pcVar12 = DAT_008e4178;
    sVar11 = (anonymous_namespace)::keyGREATER_EQUAL;
    pcVar10 = DAT_008e4168;
    sVar9 = (anonymous_namespace)::keyGREATER;
    pcVar8 = DAT_008e4148;
    sVar7 = (anonymous_namespace)::keyEQUAL;
    if (bVar18) {
      pcVar1 = (cmExpandedCommandArgument *)(p_Var2 + 1);
      cVar21 = GetDefinitionIfUnquoted(this,pcVar1);
      local_3e0._M_string_length = 0;
      local_3e0.field_2._M_local_buf[0] = '\0';
      local_3e0._M_dataplus._M_p = (pointer)paVar28;
      if (cVar21.Value == (string *)0x0) {
        cVar21.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
      }
      else {
        psVar22 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
        local_1a8[0]._M_pathname._M_string_length = (size_type)(psVar22->_M_dataplus)._M_p;
        local_1a8[0]._M_pathname._M_dataplus._M_p = (pointer)psVar22->_M_string_length;
        __str._M_str = "CMAKE_MATCH_";
        __str._M_len = 0xc;
        iVar20 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xc,
                            __str);
        if (iVar20 == 0) {
          cVar21.Value = &local_3e0;
          std::__cxx11::string::_M_assign((string *)cVar21.Value);
        }
      }
      cmMakefile::ClearMatches(this->Makefile);
      psVar22 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                          ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
      local_278 = (char *)0x0;
      local_268 = (char *)0x0;
      local_260 = 0;
      memset((RegularExpression *)local_328,0,0xaa);
      bVar18 = cmsys::RegularExpression::compile
                         ((RegularExpression *)local_328,(psVar22->_M_dataplus)._M_p);
      if (bVar18) {
        bVar19 = cmsys::RegularExpression::find
                           ((RegularExpression *)local_328,((cVar21.Value)->_M_dataplus)._M_p,
                            (RegularExpressionMatch *)local_328);
        if (bVar19) {
          cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_328);
        }
        args_00.next._M_node = p_Var30;
        args_00.current._M_node = p_Var2;
        args_00.nextnext._M_node = iVar3._M_node;
        local_340 = p_Var2;
        p_Stack_338 = p_Var30;
        local_330 = iVar3._M_node;
        cmArgumentList::ReduceTwoArgs(newArgs,bVar19,args_00);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Regular expression \"",0x14);
        poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar22->_M_dataplus)._M_p,
                             psVar22->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar24,"\" cannot compile",0x10);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)local_380,(string *)local_1c8);
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        *local_378 = FATAL_ERROR;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (local_268 != (char *)0x0) {
        operator_delete__(local_268);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar28) {
        operator_delete(local_3e0._M_dataplus._M_p,
                        CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                                 local_3e0.field_2._M_local_buf[0]) + 1);
      }
      bVar18 = !bVar18;
      goto LAB_004c14f0;
    }
    keyword_01.super_string_view._M_str = DAT_008e41d8;
    keyword_01.super_string_view._M_len = (anonymous_namespace)::keyLESS;
    bVar18 = IsKeyword(this,keyword_01,pcVar1);
    cVar29 = '\x01';
    if (!bVar18) {
      keyword_02.super_string_view._M_str = pcVar14;
      keyword_02.super_string_view._M_len = sVar13;
      bVar18 = IsKeyword(this,keyword_02,pcVar1);
      cVar29 = '\x02';
      if (!bVar18) {
        keyword_03.super_string_view._M_str = pcVar10;
        keyword_03.super_string_view._M_len = sVar9;
        bVar18 = IsKeyword(this,keyword_03,pcVar1);
        cVar29 = '\x03';
        if (!bVar18) {
          keyword_04.super_string_view._M_str = pcVar12;
          keyword_04.super_string_view._M_len = sVar11;
          bVar18 = IsKeyword(this,keyword_04,pcVar1);
          cVar29 = '\x04';
          if (!bVar18) {
            keyword_05.super_string_view._M_str = pcVar8;
            keyword_05.super_string_view._M_len = sVar7;
            bVar18 = IsKeyword(this,keyword_05,pcVar1);
            cVar29 = bVar18 * '\x05';
          }
        }
      }
    }
    pcVar14 = DAT_008e4298;
    sVar13 = (anonymous_namespace)::keySTRLESS_EQUAL;
    pcVar12 = DAT_008e4278;
    sVar11 = (anonymous_namespace)::keySTRGREATER_EQUAL;
    pcVar10 = DAT_008e4268;
    sVar9 = (anonymous_namespace)::keySTRGREATER;
    pcVar8 = DAT_008e4258;
    sVar7 = (anonymous_namespace)::keySTREQUAL;
    if (cVar29 == '\0') {
      keyword_06.super_string_view._M_str = DAT_008e4288;
      keyword_06.super_string_view._M_len = (anonymous_namespace)::keySTRLESS;
      bVar18 = IsKeyword(this,keyword_06,pcVar1);
      cVar29 = '\x01';
      if (!bVar18) {
        keyword_07.super_string_view._M_str = pcVar14;
        keyword_07.super_string_view._M_len = sVar13;
        bVar18 = IsKeyword(this,keyword_07,pcVar1);
        cVar29 = '\x02';
        if (!bVar18) {
          keyword_08.super_string_view._M_str = pcVar10;
          keyword_08.super_string_view._M_len = sVar9;
          bVar18 = IsKeyword(this,keyword_08,pcVar1);
          cVar29 = '\x03';
          if (!bVar18) {
            keyword_09.super_string_view._M_str = pcVar12;
            keyword_09.super_string_view._M_len = sVar11;
            bVar18 = IsKeyword(this,keyword_09,pcVar1);
            cVar29 = '\x04';
            if (!bVar18) {
              keyword_10.super_string_view._M_str = pcVar8;
              keyword_10.super_string_view._M_len = sVar7;
              bVar18 = IsKeyword(this,keyword_10,pcVar1);
              cVar29 = bVar18 * '\x05';
            }
          }
        }
      }
      pcVar14 = DAT_008e4308;
      sVar13 = (anonymous_namespace)::keyVERSION_LESS_EQUAL;
      pcVar12 = DAT_008e42e8;
      sVar11 = (anonymous_namespace)::keyVERSION_GREATER_EQUAL;
      pcVar10 = DAT_008e42d8;
      sVar9 = (anonymous_namespace)::keyVERSION_GREATER;
      pcVar8 = DAT_008e42c8;
      sVar7 = (anonymous_namespace)::keyVERSION_EQUAL;
      if (cVar29 != '\0') {
        cVar21 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(p_Var2 + 1));
        if (cVar21.Value == (string *)0x0) {
          cVar21.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                   ((cmExpandedCommandArgument *)(p_Var2 + 1));
        }
        cVar23 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar3._M_node + 1));
        if (cVar23.Value == (string *)0x0) {
          cmExpandedCommandArgument::GetValue_abi_cxx11_
                    ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        }
        iVar20 = std::__cxx11::string::compare((string *)cVar21.Value);
        switch(cVar29) {
        case '\x01':
          bVar18 = SUB41((uint)iVar20 >> 0x1f,0);
          break;
        case '\x02':
          bVar18 = iVar20 < 1;
          break;
        case '\x03':
          bVar18 = 0 < iVar20;
          break;
        case '\x04':
          bVar18 = -1 < iVar20;
          break;
        default:
          bVar18 = cVar29 == '\x05' && iVar20 == 0;
        }
        args_02.next._M_node = p_Var30;
        args_02.current._M_node = p_Var2;
        args_02.nextnext._M_node = iVar3._M_node;
        local_210 = p_Var2;
        p_Stack_208 = p_Var30;
        local_200 = iVar3._M_node;
        cmArgumentList::ReduceTwoArgs(newArgs,bVar18,args_02);
        bVar18 = false;
        goto LAB_004c14f0;
      }
      keyword_11.super_string_view._M_str = DAT_008e42f8;
      keyword_11.super_string_view._M_len = (anonymous_namespace)::keyVERSION_LESS;
      bVar18 = IsKeyword(this,keyword_11,pcVar1);
      uVar27 = 1;
      if (!bVar18) {
        keyword_12.super_string_view._M_str = pcVar14;
        keyword_12.super_string_view._M_len = sVar13;
        bVar18 = IsKeyword(this,keyword_12,pcVar1);
        uVar27 = 2;
        if (!bVar18) {
          keyword_13.super_string_view._M_str = pcVar10;
          keyword_13.super_string_view._M_len = sVar9;
          bVar18 = IsKeyword(this,keyword_13,pcVar1);
          uVar27 = 3;
          if (!bVar18) {
            keyword_14.super_string_view._M_str = pcVar12;
            keyword_14.super_string_view._M_len = sVar11;
            bVar18 = IsKeyword(this,keyword_14,pcVar1);
            uVar27 = 4;
            if (!bVar18) {
              keyword_15.super_string_view._M_str = pcVar8;
              keyword_15.super_string_view._M_len = sVar7;
              bVar18 = IsKeyword(this,keyword_15,pcVar1);
              uVar27 = (uint)bVar18 + (uint)bVar18 * 4;
            }
          }
        }
      }
      if (uVar27 == 0) {
        keyword_16.super_string_view._M_str = DAT_008e41b8;
        keyword_16.super_string_view._M_len = (anonymous_namespace)::keyIS_NEWER_THAN;
        bVar18 = IsKeyword(this,keyword_16,pcVar1);
        if (bVar18) {
          local_1a8[0]._M_pathname._M_dataplus._M_p =
               local_1a8[0]._M_pathname._M_dataplus._M_p & 0xffffffff00000000;
          psVar22 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                              ((cmExpandedCommandArgument *)(p_Var2 + 1));
          f2 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                         ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
          SVar25 = cmsys::SystemTools::FileTimeCompare(psVar22,f2,(int *)local_1a8);
          bVar18 = (uint)local_1a8[0]._M_pathname._M_dataplus._M_p < 2 || SVar25.Kind_ != Success;
          local_240 = p_Var2;
          p_Stack_238 = p_Var30;
          local_230 = iVar3._M_node;
          goto LAB_004c1403;
        }
        keyword_17.super_string_view._M_str = DAT_008e4188;
        keyword_17.super_string_view._M_len = (anonymous_namespace)::keyIN_LIST;
        bVar18 = IsKeyword(this,keyword_17,pcVar1);
        if (!bVar18) {
          keyword_18.super_string_view._M_str = DAT_008e4318;
          keyword_18.super_string_view._M_len = (anonymous_namespace)::keyPATH_EQUAL;
          bVar19 = IsKeyword(this,keyword_18,pcVar1);
          bVar18 = false;
          if (bVar19) {
            if (WARN < this->Policy139Status) {
              cVar21 = GetVariableOrString(this,(cmExpandedCommandArgument *)(p_Var2 + 1));
              cVar23 = GetVariableOrString(this,(cmExpandedCommandArgument *)(iVar3._M_node + 1));
              local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
              pcVar5 = ((cVar21.Value)->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3a0,pcVar5,pcVar5 + (cVar21.Value)->_M_string_length);
              cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                        ((cmCMakePath *)local_1a8,&local_3a0,generic_format);
              local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
              pcVar5 = ((cVar23.Value)->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3c0,pcVar5,pcVar5 + (cVar23.Value)->_M_string_length);
              cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                        ((cmCMakePath *)local_328,&local_3c0,generic_format);
              iVar20 = std::filesystem::__cxx11::path::compare(local_1a8);
              std::filesystem::__cxx11::path::~path((path *)local_328);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                operator_delete(local_3c0._M_dataplus._M_p,
                                local_3c0.field_2._M_allocated_capacity + 1);
              }
              std::filesystem::__cxx11::path::~path(local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p,
                                local_3a0.field_2._M_allocated_capacity + 1);
              }
              bVar19 = iVar20 == 0;
              local_258 = p_Var2;
              p_Stack_250 = p_Var30;
              local_248 = iVar3._M_node;
              p_Var15 = local_1f8;
              p_Var16 = p_Stack_1f0;
              iVar17._M_node = local_1e8;
              goto LAB_004c14e8;
            }
            if (this->Policy139Status == WARN) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_328,(cmPolicies *)0x8b,id_00);
              poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_328._0_8_,local_328._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar24,
                         "\nPATH_EQUAL will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                         ,0x89);
              if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
                operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
              }
              pcVar4 = this->Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,(string *)local_328);
              goto LAB_004c16fc;
            }
          }
          goto LAB_004c14f0;
        }
        if (this->Policy57Status < NEW) {
          bVar18 = false;
          if (this->Policy57Status == WARN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_328,(cmPolicies *)0x39,id);
            poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_328._0_8_,local_328._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar24,
                       "\nIN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       ,0x86);
            if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
              operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
            }
            pcVar4 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,(string *)local_328);
LAB_004c16fc:
            bVar18 = false;
            if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
              operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          goto LAB_004c14f0;
        }
        cVar21 = GetVariableOrString(this,(cmExpandedCommandArgument *)(p_Var2 + 1));
        pcVar4 = this->Makefile;
        psVar22 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                            ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        cVar23 = cmMakefile::GetDefinition(pcVar4,psVar22);
        if (cVar23.Value == (string *)0x0) {
          bVar18 = false;
        }
        else {
          arg._M_str = ((cVar23.Value)->_M_dataplus)._M_p;
          arg._M_len = (cVar23.Value)->_M_string_length;
          cmExpandedList_abi_cxx11_(&local_370,arg,true);
          _Var26 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (local_370.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              local_370.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,cVar21.Value);
          bVar18 = _Var26._M_current !=
                   local_370.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        args_04.next._M_node = p_Var30;
        args_04.current._M_node = p_Var2;
        args_04.nextnext._M_node = iVar3._M_node;
        local_358 = p_Var2;
        p_Stack_350 = p_Var30;
        local_348 = iVar3._M_node;
        cmArgumentList::ReduceTwoArgs(newArgs,bVar18,args_04);
        if (cVar23.Value != (string *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_370);
        }
      }
      else {
        op = (&UINT_0072b47c)[uVar27];
        cVar21 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(p_Var2 + 1));
        if (cVar21.Value == (string *)0x0) {
          cVar21.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                   ((cmExpandedCommandArgument *)(p_Var2 + 1));
        }
        cVar23 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar3._M_node + 1));
        if (cVar23.Value == (string *)0x0) {
          cVar23.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                   ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        }
        bVar18 = cmSystemTools::VersionCompare(op,cVar21.Value,cVar23.Value);
        local_228 = p_Var2;
        p_Stack_220 = p_Var30;
        local_218 = iVar3._M_node;
LAB_004c1403:
        args_01.next._M_node = p_Var30;
        args_01.current._M_node = p_Var2;
        args_01.nextnext._M_node = iVar3._M_node;
        cmArgumentList::ReduceTwoArgs(newArgs,bVar18,args_01);
      }
      bVar18 = false;
      goto LAB_004c14f0;
    }
    cVar21 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(p_Var2 + 1));
    if (cVar21.Value == (string *)0x0) {
      cVar21.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                               ((cmExpandedCommandArgument *)(p_Var2 + 1));
    }
    cVar23 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar3._M_node + 1));
    if (cVar23.Value == (string *)0x0) {
      cVar23.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                               ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
    }
    iVar20 = __isoc99_sscanf(((cVar21.Value)->_M_dataplus)._M_p,"%lg",local_1a8);
    bVar19 = false;
    p_Var15 = p_Var2;
    p_Var16 = p_Var30;
    iVar17._M_node = iVar3._M_node;
    if (iVar20 != 1) goto LAB_004c14e8;
    bVar19 = false;
    iVar20 = __isoc99_sscanf(((cVar23.Value)->_M_dataplus)._M_p,"%lg",local_328);
    if (iVar20 != 1) goto LAB_004c14e8;
    switch(cVar29) {
    case '\x01':
      bVar18 = (double)local_328._0_8_ < (double)local_1a8[0]._M_pathname._M_dataplus._M_p;
      break;
    case '\x02':
      bVar19 = (double)local_328._0_8_ < (double)local_1a8[0]._M_pathname._M_dataplus._M_p;
      goto LAB_004c1493;
    case '\x03':
      bVar18 = (double)local_1a8[0]._M_pathname._M_dataplus._M_p < (double)local_328._0_8_;
      break;
    case '\x04':
      bVar19 = (double)local_1a8[0]._M_pathname._M_dataplus._M_p < (double)local_328._0_8_;
LAB_004c1493:
      bVar19 = !bVar19;
      goto LAB_004c14e8;
    default:
      bVar19 = (double)local_1a8[0]._M_pathname._M_dataplus._M_p == (double)local_328._0_8_ &&
               cVar29 == '\x05';
      goto LAB_004c14e8;
    }
    bVar19 = !bVar18 && (double)local_1a8[0]._M_pathname._M_dataplus._M_p != (double)local_328._0_8_
    ;
LAB_004c14e8:
    local_1e8 = iVar17._M_node;
    p_Stack_1f0 = p_Var16;
    local_1f8 = p_Var15;
    bVar18 = false;
    args_03.next._M_node = p_Var30;
    args_03.current._M_node = p_Var2;
    args_03.nextnext._M_node = iVar3._M_node;
    cmArgumentList::ReduceTwoArgs(newArgs,bVar19,args_03);
LAB_004c14f0:
    if (bVar18) {
      return bVar6;
    }
    p_Var2 = p_Var2->_M_next;
    p_Var30 = p_Var2;
    if (p_Var2 != (_List_node_base *)newArgs) {
      p_Var30 = p_Var2->_M_next;
    }
    iVar3._M_node = p_Var30;
    if (p_Var30 != (_List_node_base *)newArgs) {
      iVar3._M_node = p_Var30->_M_next;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    // NOTE Handle special case `if(... BLAH_BLAH MATCHES)`
    // (i.e., w/o regex to match which is possibly result of
    // variable expansion to an empty string)
    if (args.next != newArgs.end() &&
        this->IsKeyword(keyMATCHES, *args.current)) {
      newArgs.ReduceOneArg(false, args);
    }

    // NOTE Fail fast: All the binary ops below require 2 arguments.
    else if (args.next == newArgs.end() || args.nextnext == newArgs.end()) {
      continue;
    }

    else if (this->IsKeyword(keyMATCHES, *args.next)) {
      cmValue def = this->GetDefinitionIfUnquoted(*args.current);

      std::string def_buf;
      if (!def) {
        def = cmValue(args.current->GetValue());
      } else if (cmHasLiteralPrefix(args.current->GetValue(),
                                    "CMAKE_MATCH_")) {
        // The string to match is owned by our match result variables.
        // Move it to our own buffer before clearing them.
        def_buf = *def;
        def = cmValue(def_buf);
      }

      this->Makefile.ClearMatches();

      const auto& rex = args.nextnext->GetValue();
      cmsys::RegularExpression regEntry;
      if (!regEntry.compile(rex)) {
        std::ostringstream error;
        error << "Regular expression \"" << rex << "\" cannot compile";
        errorString = error.str();
        status = MessageType::FATAL_ERROR;
        return false;
      }

      const auto match = regEntry.find(*def);
      if (match) {
        this->Makefile.StoreMatches(regEntry);
      }
      newArgs.ReduceTwoArgs(match, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyLESS, keyLESS_EQUAL, keyGREATER,
                                keyGREATER_EQUAL, keyEQUAL))) {

      cmValue ldef = this->GetVariableOrString(*args.current);
      cmValue rdef = this->GetVariableOrString(*args.nextnext);

      double lhs;
      double rhs;
      auto parseDoubles = [&]() {
        return std::sscanf(ldef->c_str(), "%lg", &lhs) == 1 &&
          std::sscanf(rdef->c_str(), "%lg", &rhs) == 1;
      };
      // clang-format off
      const auto result = parseDoubles() &&
        cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo = this->matchKeys(*args.next, keySTRLESS,
                                        keySTRLESS_EQUAL, keySTRGREATER,
                                        keySTRGREATER_EQUAL, keySTREQUAL))) {

      const cmValue lhs = this->GetVariableOrString(*args.current);
      const cmValue rhs = this->GetVariableOrString(*args.nextnext);
      const auto val = (*lhs).compare(*rhs);
      // clang-format off
      const auto result = cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, val, 0);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyVERSION_LESS,
                                keyVERSION_LESS_EQUAL, keyVERSION_GREATER,
                                keyVERSION_GREATER_EQUAL, keyVERSION_EQUAL))) {
      const auto op = MATCH2CMPOP[matchNo - 1];
      const std::string& lhs = this->GetVariableOrString(*args.current);
      const std::string& rhs = this->GetVariableOrString(*args.nextnext);
      const auto result = cmSystemTools::VersionCompare(op, lhs, rhs);
      newArgs.ReduceTwoArgs(result, args);
    }

    // is file A newer than file B
    else if (this->IsKeyword(keyIS_NEWER_THAN, *args.next)) {
      auto fileIsNewer = 0;
      cmsys::Status ftcStatus = cmSystemTools::FileTimeCompare(
        args.current->GetValue(), args.nextnext->GetValue(), &fileIsNewer);
      newArgs.ReduceTwoArgs(
        (!ftcStatus || fileIsNewer == 1 || fileIsNewer == 0), args);
    }

    else if (this->IsKeyword(keyIN_LIST, *args.next)) {

      if (this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->Makefile.GetDefinition(args.nextnext->GetValue());

        newArgs.ReduceTwoArgs(
          rhs && cm::contains(cmExpandedList(*rhs, true), *lhs), args);
      }

      else if (this->Policy57Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057)
          << "\n"
             "IN_LIST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }

    else if (this->IsKeyword(keyPATH_EQUAL, *args.next)) {

      if (this->Policy139Status != cmPolicies::OLD &&
          this->Policy139Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->GetVariableOrString(*args.nextnext);
        const auto result = cmCMakePath{ *lhs } == cmCMakePath{ *rhs };
        newArgs.ReduceTwoArgs(result, args);
      }

      else if (this->Policy139Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0139)
          << "\n"
             "PATH_EQUAL will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }
  }
  return true;
}